

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_kj::String,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:522:11),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_kj::String,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:522:11),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::_::Void> *pEVar1;
  String *in_00;
  Void local_5e1;
  ExceptionOr<kj::_::Void> local_5e0;
  String *local_478;
  String *depValue;
  ExceptionOr<kj::_::Void> local_318;
  Exception *local_1b0;
  Exception *depException;
  undefined1 local_198 [8];
  ExceptionOr<kj::String> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::_::Void,_kj::String,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:522:11),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.field_1.value.content.disposer = (ArrayDisposer *)output;
  ExceptionOr<kj::String>::ExceptionOr((ExceptionOr<kj::String> *)local_198);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_198);
  local_1b0 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_198);
  if (local_1b0 == (Exception *)0x0) {
    local_478 = readMaybe<kj::String>
                          ((Maybe<kj::String> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_478 != (String *)0x0) {
      in_00 = mv<kj::String>(local_478);
      MaybeVoidCaller<kj::String,kj::_::Void>::
      apply<kj::(anonymous_namespace)::testHttpClientResponse(kj::WaitScope&,kj::(anonymous_namespace)::HttpResponseTestCase_const&,unsigned_long,kj::TwoWayPipe)::__3>
                (&this->func,in_00);
      handle(&local_5e0,this,&local_5e1);
      pEVar1 = ExceptionOrValue::as<kj::_::Void>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.content.disposer);
      ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_5e0);
      ExceptionOr<kj::_::Void>::~ExceptionOr(&local_5e0);
    }
  }
  else {
    in = mv<kj::Exception>(local_1b0);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x28,in)
    ;
    handle(&local_318,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::_::Void>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.content.disposer);
    ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_318);
    ExceptionOr<kj::_::Void>::~ExceptionOr(&local_318);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::String>::~ExceptionOr((ExceptionOr<kj::String> *)local_198);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }